

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Clara::Parser::parseIntoTokens
          (Parser *this,string *arg,
          vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *tokens)

{
  pointer pcVar1;
  long *plVar2;
  long lVar3;
  long *plVar4;
  size_type sVar5;
  Token token;
  long *local_b0;
  long *local_a8;
  long local_a0;
  long alStack_98 [2];
  long *local_88;
  long local_80;
  long local_78 [2];
  undefined1 local_68 [8];
  _Alloc_hider local_60;
  ulong local_58;
  char local_50 [16];
  Parser *local_40;
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *local_38;
  
  sVar5 = arg->_M_string_length;
  if (sVar5 != 0) {
    local_40 = this;
    local_38 = tokens;
    do {
      local_60._M_p = local_50;
      local_68._0_4_ = Positional;
      pcVar1 = (arg->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>((string *)&local_60,pcVar1,pcVar1 + sVar5);
      std::__cxx11::string::_M_replace((ulong)arg,0,(char *)arg->_M_string_length,0x1449cd);
      if (*local_60._M_p == '-') {
        if ((local_58 < 2) || (local_60._M_p[1] != '-')) {
          std::__cxx11::string::substr((ulong)&local_88,(ulong)&local_60);
          local_b0 = (long *)CONCAT44(local_b0._4_4_,1);
          local_a8 = alStack_98;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a8,local_88,local_80 + (long)local_88);
          local_68._0_4_ = (Type)local_b0;
          std::__cxx11::string::operator=((string *)&local_60,(string *)&local_a8);
          if (local_a8 != alStack_98) {
            operator_delete(local_a8);
          }
          if (local_88 != local_78) {
            operator_delete(local_88);
          }
          if ((1 < local_58) &&
             (lVar3 = std::__cxx11::string::find((char)local_40,(ulong)(uint)(int)local_60._M_p[1]),
             lVar3 == -1)) {
            std::__cxx11::string::substr((ulong)&local_88,(ulong)&local_60);
            plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,0x143b86);
            plVar4 = plVar2 + 2;
            if ((long *)*plVar2 == plVar4) {
              local_a0 = *plVar4;
              alStack_98[0] = plVar2[3];
              local_b0 = &local_a0;
            }
            else {
              local_a0 = *plVar4;
              local_b0 = (long *)*plVar2;
            }
            local_a8 = (long *)plVar2[1];
            *plVar2 = (long)plVar4;
            plVar2[1] = 0;
            *(undefined1 *)(plVar2 + 2) = 0;
            std::__cxx11::string::operator=((string *)arg,(string *)&local_b0);
            if (local_b0 != &local_a0) {
              operator_delete(local_b0);
            }
            if (local_88 != local_78) {
              operator_delete(local_88);
            }
            std::__cxx11::string::substr((ulong)&local_b0,(ulong)&local_60);
            std::__cxx11::string::operator=((string *)&local_60,(string *)&local_b0);
            plVar2 = local_b0;
            if (local_b0 != &local_a0) goto LAB_00132fef;
          }
        }
        else {
          std::__cxx11::string::substr((ulong)&local_88,(ulong)&local_60);
          local_b0 = (long *)CONCAT44(local_b0._4_4_,2);
          local_a8 = alStack_98;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a8,local_88,local_80 + (long)local_88);
          local_68._0_4_ = (Type)local_b0;
          std::__cxx11::string::operator=((string *)&local_60,(string *)&local_a8);
          if (local_a8 != alStack_98) {
            operator_delete(local_a8);
          }
          plVar2 = local_88;
          if (local_88 != local_78) {
LAB_00132fef:
            operator_delete(plVar2);
          }
        }
      }
      if ((local_68._0_4_ != Positional) &&
         (lVar3 = std::__cxx11::string::find_first_of
                            ((char *)&local_60,(ulong)(local_40->separators)._M_dataplus._M_p,0),
         lVar3 != -1)) {
        std::__cxx11::string::substr((ulong)&local_b0,(ulong)&local_60);
        std::__cxx11::string::operator=((string *)arg,(string *)&local_b0);
        if (local_b0 != &local_a0) {
          operator_delete(local_b0);
        }
        std::__cxx11::string::substr((ulong)&local_b0,(ulong)&local_60);
        std::__cxx11::string::operator=((string *)&local_60,(string *)&local_b0);
        if (local_b0 != &local_a0) {
          operator_delete(local_b0);
        }
      }
      std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::push_back
                (local_38,(value_type *)local_68);
      if (local_60._M_p != local_50) {
        operator_delete(local_60._M_p);
      }
      sVar5 = arg->_M_string_length;
    } while (sVar5 != 0);
  }
  return;
}

Assistant:

void parseIntoTokens( std::string arg, std::vector<Parser::Token>& tokens ) const {
            while( !arg.empty() ) {
                Parser::Token token( Parser::Token::Positional, arg );
                arg = "";
                if( token.data[0] == '-' ) {
                    if( token.data.size() > 1 && token.data[1] == '-' ) {
                        token = Parser::Token( Parser::Token::LongOpt, token.data.substr( 2 ) );
                    }
                    else {
                        token = Parser::Token( Parser::Token::ShortOpt, token.data.substr( 1 ) );
                        if( token.data.size() > 1 && separators.find( token.data[1] ) == std::string::npos ) {
                            arg = "-" + token.data.substr( 1 );
                            token.data = token.data.substr( 0, 1 );
                        }
                    }
                }
                if( token.type != Parser::Token::Positional ) {
                    std::size_t pos = token.data.find_first_of( separators );
                    if( pos != std::string::npos ) {
                        arg = token.data.substr( pos+1 );
                        token.data = token.data.substr( 0, pos );
                    }
                }
                tokens.push_back( token );
            }
        }